

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_construct.cpp
# Opt level: O1

void __thiscall tst_qpromise_construct::connectAndResolve(tst_qpromise_construct *this)

{
  QSharedData *pQVar1;
  _Atomic_word *p_Var2;
  int iVar3;
  QSharedData *pQVar4;
  PromiseResolver<void> PVar5;
  _Manager_type p_Var6;
  PromiseResolver<std::shared_ptr<int>_> PVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  QObject *this_00;
  PromiseData<std::shared_ptr<int>_> *this_01;
  undefined4 *puVar11;
  char *pcVar12;
  char *pcVar13;
  PromiseDataBase<void,_void_()> *this_02;
  element_type *peVar14;
  QObject *oldD;
  char *reject;
  QSharedData *pQVar15;
  _func_int **pp_Var16;
  __weak_count<(__gnu_cxx::_Lock_policy)2> this_03;
  QByteArrayView QVar17;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e0;
  PromiseResolver<void> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_d0;
  QPromise<void> local_c8;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type p_Stack_a0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  PromiseResolver<std::shared_ptr<int>_> resolver;
  weak_ptr<int> wptr;
  QObject local_48 [8];
  code *local_40;
  undefined8 local_38;
  
  this_00 = (QObject *)operator_new(0x10);
  QObject::QObject(this_00,(QObject *)0x0);
  wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (PromiseData<std::shared_ptr<int>_> *)operator_new(0x68);
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
    super_QSharedData = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_error.m_data = (exception_ptr)0x0;
  ((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)&this_01->m_value)
  ->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_catchers.d.ptr)->d =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_catchers.d.size)->d = 0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_handlers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_catchers.d.d = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_handlers.d.ptr)->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
    m_lock = 0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
    m_settled = 0;
  *(undefined8 *)
   &((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)&this_01->m_value
    )->super_QSharedData = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00126c98;
  QReadWriteLock::QReadWriteLock
            (&(this_01->
              super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
              m_lock,0);
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_settled = false;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_handlers.d.ptr)->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_handlers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_catchers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_catchers.d.ptr)->d =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_catchers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_error.m_data = (exception_ptr)0x0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_00126c30;
  ((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)&this_01->m_value)
  ->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)&this_01->m_value
    )->super_QSharedData = 0;
  LOCK();
  pQVar4 = &(this_01->
            super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
            super_QSharedData;
  pQVar4->ref = (QAtomicInt)((int)pQVar4->ref + 1);
  UNLOCK();
  LOCK();
  pQVar4 = &(this_01->
            super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
            super_QSharedData;
  pQVar4->ref = (QAtomicInt)((int)pQVar4->ref + 1);
  UNLOCK();
  pQVar4 = &(this_01->
            super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
            super_QSharedData;
  local_b8._M_unused._M_object = &PTR__QPromiseBase_00126bf8;
  local_b8._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::PromiseResolver
            (&resolver,(QPromise<std::shared_ptr<int>_> *)&local_b8);
  local_b8._M_unused._M_object = &PTR__QPromiseBase_00126888;
  if ((PromiseData<std::shared_ptr<int>_> *)local_b8._8_8_ !=
      (PromiseData<std::shared_ptr<int>_> *)0x0) {
    LOCK();
    pQVar15 = (QSharedData *)(local_b8._8_8_ + 8);
    (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<std::shared_ptr<int>_> *)local_b8._8_8_ !=
        (PromiseData<std::shared_ptr<int>_> *)0x0)) {
      (**(code **)(*(long *)local_b8._8_8_ + 8))();
    }
  }
  PVar7.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_40 = QObject::objectNameChanged;
  local_38 = 0;
  puVar11 = (undefined4 *)operator_new(0x28);
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
  }
  *puVar11 = 1;
  *(code **)(puVar11 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp:288:25),_1,_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(weak_ptr<int> **)(puVar11 + 4) = &wptr;
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data> *)
  (puVar11 + 6))->d = (Data *)PVar7.m_d.d;
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data> *)
  (puVar11 + 8))->d = (Data *)PVar7.m_d.d;
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
  }
  QObject::connectImpl
            (local_48,(void **)this_00,(QObject *)&local_40,(void **)this_00,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar11,(int *)0x1,(QMetaObject *)0x0);
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  QMetaObject::Connection::~Connection((Connection *)local_48);
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar8 = QtPromisePrivate::
          PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::isPending
                    ((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)
                     this_01);
  local_b8._M_pod_data[0] = bVar8;
  resolver.m_d.d._0_1_ = 1;
  pcVar12 = QTest::toString<bool>((bool *)local_b8._M_pod_data);
  pcVar13 = QTest::toString<bool>((bool *)&resolver);
  reject = "p.isPending()";
  cVar9 = QTest::compare_helper
                    (bVar8,"Compared values are not the same",pcVar12,pcVar13,"p.isPending()","true"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                     ,0x12d);
  if (cVar9 != '\0') {
    QVar17.m_data = (storage_type *)0x6;
    QVar17.m_size = (qsizetype)&local_b8;
    QString::fromUtf8(QVar17);
    p_Var6 = local_a8;
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
          )(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
            )local_b8._M_unused._0_8_;
    QObject::setObjectName((QString *)this_00);
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
      UNLOCK();
      if (*(int *)resolver.m_d.d == 0) {
        QArrayData::deallocate((QArrayData *)resolver.m_d.d,2,8);
      }
    }
    local_98 = (element_type *)0x0;
    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_02 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
    this_02->_vptr_PromiseDataBase = (_func_int **)0x0;
    *(undefined8 *)&this_02->super_QSharedData = 0;
    (this_02->m_catchers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_02->m_catchers).d.size = 0;
    (this_02->m_handlers).d.size = 0;
    (this_02->m_catchers).d.d = (Data *)0x0;
    (this_02->m_handlers).d.d = (Data *)0x0;
    (this_02->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0
    ;
    *(undefined8 *)&this_02->m_lock = 0;
    *(undefined8 *)&this_02->m_settled = 0;
    (this_02->m_error).m_data._M_exception_object = (void *)0x0;
    this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00126b00;
    QReadWriteLock::QReadWriteLock(&this_02->m_lock,0);
    this_02->m_settled = false;
    (this_02->m_handlers).d.d = (Data *)0x0;
    (this_02->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0
    ;
    (this_02->m_handlers).d.size = 0;
    (this_02->m_catchers).d.d = (Data *)0x0;
    (this_02->m_catchers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_02->m_catchers).d.size = 0;
    (this_02->m_error).m_data._M_exception_object = (void *)0x0;
    this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00126a98;
    LOCK();
    (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar15 = &this_02->super_QSharedData;
    local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a60
    ;
    local_c8.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_02;
    QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,&local_c8);
    local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126858
    ;
    if (&(local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0) {
      LOCK();
      pQVar1 = &((local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (&(local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
          (PromiseDataBase<void,_void_()> *)0x0)) {
        (*((local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
          _vptr_PromiseDataBase[1])();
      }
    }
    PVar5.m_d.d = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    local_e0 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    local_d0 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    local_a8 = (_Manager_type)0x0;
    p_Stack_a0 = (_Invoker_type)0x0;
    local_b8._M_unused._M_object = (_func_int **)0x0;
    local_b8._8_8_ = (PromiseData<std::shared_ptr<int>_> *)0x0;
    local_b8._M_unused._M_object = operator_new(0x18);
    *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
     local_b8._M_unused._0_8_ = PVar5.m_d.d;
    if (PVar5.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + 1;
      UNLOCK();
    }
    ((Data *)local_b8._M_unused._0_8_)->promise = (QPromise<std::shared_ptr<int>_> *)PVar5.m_d.d;
    if (PVar5.m_d.d == (Data *)0x0) {
      *(Data **)((long)local_b8._M_unused._0_8_ + 0x10) = (Data *)&local_98;
      p_Stack_a0 = std::
                   _Function_handler<void_(const_std::shared_ptr<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                   ::_M_invoke;
      local_a8 = std::
                 _Function_handler<void_(const_std::shared_ptr<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_manager;
    }
    else {
      LOCK();
      *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + 1;
      UNLOCK();
      *(Data **)((long)local_b8._M_unused._0_8_ + 0x10) = (Data *)&local_98;
      p_Stack_a0 = std::
                   _Function_handler<void_(const_std::shared_ptr<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                   ::_M_invoke;
      local_a8 = std::
                 _Function_handler<void_(const_std::shared_ptr<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_manager;
      LOCK();
      *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar5.m_d.d == 0) {
        operator_delete((void *)PVar5.m_d.d,0x10);
      }
    }
    if (PVar5.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar5.m_d.d == 0) {
        operator_delete((void *)PVar5.m_d.d,0x10);
      }
    }
    QtPromisePrivate::PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::
    addHandler((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)this_01
               ,(function<void_(const_std::shared_ptr<int>_&)> *)&local_b8);
    if (local_a8 != (_Manager_type)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    QtPromisePrivate::PromiseCatcher<std::shared_ptr<int>,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
              ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
               (PromiseCatcher<std::shared_ptr<int>,decltype(nullptr),void> *)0x0,&local_e0,
               (QPromiseResolve<void> *)&local_d0,(QPromiseReject<void> *)reject);
    QtPromisePrivate::PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::
    addCatcher((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)this_01
               ,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
    if (p_Var6 != (_Manager_type)0x0) {
      (*p_Var6)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
    }
    if (local_d0.d != (Data *)0x0) {
      LOCK();
      ((local_d0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            ((local_d0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if (((__int_type)
           ((local_d0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
         (local_d0.d != (Data *)0x0)) {
        operator_delete(local_d0.d,0x10);
      }
    }
    if (local_e0.d != (Data *)0x0) {
      LOCK();
      ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int>._M_i =
           ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
         (local_e0.d != (Data *)0x0)) {
        operator_delete(local_e0.d,0x10);
      }
    }
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
      UNLOCK();
      if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
        operator_delete((void *)resolver_1.m_d.d,0x10);
      }
    }
    bVar8 = QtPromisePrivate::
            PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::isPending
                      ((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *
                       )this_01);
    if (!bVar8) {
      QtPromisePrivate::PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::
      dispatch((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)this_01
              );
    }
    bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
    while (bVar8 != false) {
      QCoreApplication::processEvents();
      QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
      bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
    }
    LOCK();
    (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*this_02->_vptr_PromiseDataBase[1])(this_02);
    }
    LOCK();
    (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*this_02->_vptr_PromiseDataBase[1])(this_02);
    }
    this_03._M_pi = wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar10 = (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count;
      do {
        if (iVar10 == 0) {
          this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar3 = (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count;
        bVar8 = iVar10 == iVar3;
        if (bVar8) {
          (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               iVar10 + 1;
          iVar3 = iVar10;
        }
        iVar10 = iVar3;
        UNLOCK();
      } while (!bVar8);
    }
    if (this_03._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar8 = true;
    }
    else {
      bVar8 = (this_03._M_pi)->_M_use_count == 0;
    }
    peVar14 = (element_type *)0x0;
    if (!bVar8) {
      peVar14 = wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    cVar9 = QTest::compare_helper
                      (local_98 == peVar14,"Compared values are not the same",(char *)0x0,
                       (char *)0x0,"waitForValue(p, std::shared_ptr<int>{})","wptr.lock()",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                       ,0x131);
    if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
    }
    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
    }
    if (cVar9 != '\0') {
      if (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pp_Var16 = (_func_int **)0x0;
      }
      else {
        pp_Var16 = (_func_int **)
                   (long)(wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                         ->_M_use_count;
      }
      local_98 = (element_type *)0x1;
      local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = pp_Var16;
      pcVar12 = QTest::toString<long>((long *)&local_c8);
      pcVar13 = QTest::toString<long>((long *)&local_98);
      cVar9 = QTest::compare_helper
                        (pp_Var16 == (_func_int **)0x1,"Compared values are not the same",pcVar12,
                         pcVar13,"wptr.use_count()","1l",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                         ,0x132);
      LOCK();
      pQVar4->ref = (QAtomicInt)((int)pQVar4->ref + -1);
      UNLOCK();
      if (((QAtomicInteger<int>)pQVar4->ref).super_QAtomicInteger<int> == (QAtomicInteger<int>)0x0)
      {
        (*(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>
          )._vptr_PromiseDataBase[1])(this_01);
      }
      if (cVar9 != '\0') {
        if (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pp_Var16 = (_func_int **)0x0;
        }
        else {
          pp_Var16 = (_func_int **)
                     (long)(wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                           )->_M_use_count;
        }
        local_98 = (element_type *)0x0;
        local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = pp_Var16;
        pcVar12 = QTest::toString<long>((long *)&local_c8);
        pcVar13 = QTest::toString<long>((long *)&local_98);
        QTest::compare_helper
                  (pp_Var16 == (_func_int **)0x0,"Compared values are not the same",pcVar12,pcVar13,
                   "wptr.use_count()","0l",
                   "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                   ,0x135);
      }
      goto LAB_0010c6a5;
    }
  }
  LOCK();
  pQVar4->ref = (QAtomicInt)((int)pQVar4->ref + -1);
  UNLOCK();
  if (((QAtomicInteger<int>)pQVar4->ref).super_QAtomicInteger<int> == (QAtomicInteger<int>)0x0) {
    (*(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
      _vptr_PromiseDataBase[1])(this_01);
  }
LAB_0010c6a5:
  if (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &(wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar10 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar10 = (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_weak_count;
      (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count =
           iVar10 + -1;
    }
    if (iVar10 == 1) {
      (*(wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  (**(code **)(*(long *)this_00 + 0x20))(this_00);
  return;
}

Assistant:

void tst_qpromise_construct::connectAndResolve()
{
    QScopedPointer<QObject> object(new QObject{});

    std::weak_ptr<int> wptr;

    {
        auto p = QtPromise::QPromise<std::shared_ptr<int>>{
            [&](const QtPromise::QPromiseResolve<std::shared_ptr<int>>& resolve,
                const QtPromise::QPromiseReject<std::shared_ptr<int>>& reject) {
                connect(object.data(),
                        &QObject::objectNameChanged,
                        [=, &wptr](const QString& name) {
                            auto sptr = std::make_shared<int>(42);

                            wptr = sptr;

                            if (name == "foobar") {
                                resolve(sptr);
                            } else {
                                reject(42);
                            }
                        });
            }};

        QCOMPARE(p.isPending(), true);

        object->setObjectName("foobar");

        QCOMPARE(waitForValue(p, std::shared_ptr<int>{}), wptr.lock());
        QCOMPARE(wptr.use_count(), 1l); // "p" still holds a reference
    }

    QCOMPARE(wptr.use_count(), 0l);
}